

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void blend_color_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  char cVar1;
  int iVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  float a;
  float b;
  float g;
  float r;
  Operator op;
  undefined1 *local_130;
  anon_class_48_6_31ab0bab local_128;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  Operator local_e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_e8,&DAT_006dea50,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  if ((local_e8.funcSolidFP == (CompositionFunctionSolidFP)0x0) ||
     (local_e8.destFetchFP == (DestFetchProcFP)0x0)) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_128.op._0_4_ = 2;
      local_128.op._4_4_ = 0;
      local_128.spans._0_4_ = 0;
      local_128.spans._4_4_ = 0;
      local_128.solidFill = false;
      local_128._17_3_ = 0;
      local_128.bpp = BPPNone;
      local_128.data = (QSpanData *)lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                ((char *)&local_128,
                 "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit"
                );
    }
    blend_color_generic(count,spans,userData);
  }
  else {
    local_ec = -NAN;
    local_f0 = -NAN;
    local_f4 = -NAN;
    local_f8 = -NAN;
    QColor::getRgbF((QColor *)((long)userData + 0x98),&local_ec,&local_f0,&local_f4,&local_f8);
    local_128._17_3_ = 0xaaaaaa;
    local_128.solidFill = local_e8.mode == CompositionMode_Source;
    local_128.bpp = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp;
    local_128.color.r = local_ec;
    local_128.color.g = local_f0;
    local_128.color.b = local_f4;
    local_128.color.a = local_f8;
    iVar9 = count + 0x5f;
    if (-1 < count + 0x20) {
      iVar9 = count + 0x20;
    }
    local_128.data = (QSpanData *)userData;
    local_128.op = &local_e8;
    local_128.spans = spans;
    pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
       (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar1 = QThreadPool::contains((QThread *)pQVar3);
      if (cVar1 == '\0') {
        iVar9 = iVar9 >> 6;
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        iVar8 = 0;
        QSemaphore::QSemaphore((QSemaphore *)&local_130,0);
        iVar2 = 1;
        if (1 < iVar9) {
          iVar2 = iVar9;
        }
        iVar6 = 0;
        do {
          iVar7 = (count - iVar6) / (iVar9 + iVar8);
          puVar4 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar4 + 1) = 1;
          *puVar4 = QFactoryLoader::keyMap;
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4145:5)>
                    ::impl;
          *(int *)(puVar5 + 1) = iVar6;
          *(int *)((long)puVar5 + 0xc) = iVar7;
          puVar5[2] = &local_128;
          puVar5[3] = &local_130;
          puVar4[2] = puVar5;
          QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
          iVar6 = iVar6 + iVar7;
          iVar8 = iVar8 + -1;
        } while (-iVar2 != iVar8);
        QSemaphore::acquire((int)(QSemaphore *)&local_130);
        QSemaphore::~QSemaphore((QSemaphore *)&local_130);
        goto LAB_00665611;
      }
    }
    blend_color_generic_fp::anon_class_48_6_31ab0bab::operator()(&local_128,0,count);
  }
LAB_00665611:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
#if QT_CONFIG(raster_fp)
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    if (!op.funcSolidFP || !op.destFetchFP) {
        qCDebug(lcQtGuiDrawHelper, "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit");
        return blend_color_generic(count, spans, userData);
    }

    float r, g, b, a;
    data->solidColor.getRgbF(&r, &g, &b, &a);
    const QRgbaFloat32 color{r, g, b, a};
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStoreFP) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStoreFP(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                QRgbaFloat32 *dest = op.destFetchFP(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolidFP(dest, l, color, spans[c].coverage);
                if (op.destStoreFP)
                    op.destStoreFP(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
#else
    blend_color_generic(count, spans, userData);
#endif
}